

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_make_file(char *file,wchar_t line,char *path,wchar_t mode,wchar_t csize,
                           void *contents)

{
  int __fd;
  int iVar1;
  size_t sVar2;
  wchar_t local_54;
  size_t local_48;
  ssize_t wsize;
  wchar_t fd;
  void *contents_local;
  wchar_t csize_local;
  wchar_t mode_local;
  char *path_local;
  wchar_t line_local;
  char *file_local;
  
  assertion_count(file,line);
  local_54 = mode;
  if (mode < L'\0') {
    local_54 = L'Ƥ';
  }
  __fd = open(path,0x41,(ulong)(uint)local_54);
  if (__fd < 0) {
    failure_start(file,line,"Could not create %s",path);
    failure_finish((void *)0x0);
    file_local._4_4_ = L'\0';
  }
  else {
    iVar1 = fchmod(__fd,mode);
    if (iVar1 == 0) {
      if (contents != (void *)0x0) {
        if (csize < L'\0') {
          local_48 = strlen((char *)contents);
        }
        else {
          local_48 = (size_t)csize;
        }
        sVar2 = write(__fd,contents,local_48);
        if (local_48 != sVar2) {
          close(__fd);
          failure_start(file,line,"Could not write to %s",path);
          failure_finish((void *)0x0);
          close(__fd);
          return L'\0';
        }
      }
      close(__fd);
      assertion_file_mode(file,line,path,mode);
      file_local._4_4_ = L'\x01';
    }
    else {
      failure_start(file,line,"Could not chmod %s",path);
      failure_finish((void *)0x0);
      close(__fd);
      file_local._4_4_ = L'\0';
    }
  }
  return file_local._4_4_;
}

Assistant:

int
assertion_make_file(const char *file, int line,
    const char *path, int mode, int csize, const void *contents)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	/* TODO: Rework this to set file mode as well. */
	FILE *f;
	(void)mode; /* UNUSED */
	assertion_count(file, line);
	f = fopen(path, "wb");
	if (f == NULL) {
		failure_start(file, line, "Could not create file %s", path);
		failure_finish(NULL);
		return (0);
	}
	if (contents != NULL) {
		size_t wsize;

		if (csize < 0)
			wsize = strlen(contents);
		else
			wsize = (size_t)csize;
		if (wsize != fwrite(contents, 1, wsize, f)) {
			fclose(f);
			failure_start(file, line,
			    "Could not write file %s", path);
			failure_finish(NULL);
			return (0);
		}
	}
	fclose(f);
	return (1);
#else
	int fd;
	assertion_count(file, line);
	fd = open(path, O_CREAT | O_WRONLY, mode >= 0 ? mode : 0644);
	if (fd < 0) {
		failure_start(file, line, "Could not create %s", path);
		failure_finish(NULL);
		return (0);
	}
#ifdef HAVE_FCHMOD
	if (0 != fchmod(fd, (mode_t)mode))
#else
	if (0 != chmod(path, (mode_t)mode))
#endif
	{
		failure_start(file, line, "Could not chmod %s", path);
		failure_finish(NULL);
		close(fd);
		return (0);
	}
	if (contents != NULL) {
		ssize_t wsize;

		if (csize < 0)
			wsize = (ssize_t)strlen(contents);
		else
			wsize = (ssize_t)csize;
		if (wsize != write(fd, contents, wsize)) {
			close(fd);
			failure_start(file, line,
			    "Could not write to %s", path);
			failure_finish(NULL);
			close(fd);
			return (0);
		}
	}
	close(fd);
	assertion_file_mode(file, line, path, mode);
	return (1);
#endif
}